

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2Duu.cpp
# Opt level: O2

bool __thiscall EnvironmentNAV2DUU::IsValidRobotPosition(EnvironmentNAV2DUU *this,int X,int Y)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = false;
  bVar2 = false;
  if ((((-1 < X) && (bVar2 = bVar1, -1 < Y)) && (X < (this->EnvNAV2DUUCfg).EnvWidth_c)) &&
     (Y < (this->EnvNAV2DUUCfg).EnvHeight_c)) {
    if ((this->EnvNAV2DUUCfg).obsthresh <= (this->EnvNAV2DUUCfg).Grid2D[(uint)X][(uint)Y]) {
      return false;
    }
    bVar2 = (this->EnvNAV2DUUCfg).UncertaintyGrid2D[(uint)X][(uint)Y] < 1e-05;
  }
  return bVar2;
}

Assistant:

bool EnvironmentNAV2DUU::IsValidRobotPosition(int X, int Y)
{
    return (X >= 0 && X < EnvNAV2DUUCfg.EnvWidth_c && Y >= 0 && Y < EnvNAV2DUUCfg.EnvHeight_c &&
            EnvNAV2DUUCfg.Grid2D[X][Y] < EnvNAV2DUUCfg.obsthresh &&
            EnvNAV2DUUCfg.UncertaintyGrid2D[X][Y] < NAV2DUU_ERR_EPS);
}